

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TestSpec * Catch::parseTestSpec(string *arg)

{
  TestSpecParser *in_RDI;
  long in_FS_OFFSET;
  ITagAliasRegistry *in_stack_fffffffffffffec8;
  TestSpecParser *this;
  string *arg_00;
  TestSpecParser *in_stack_fffffffffffffee8;
  string local_f0 [7];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  ITagAliasRegistry::get();
  arg_00 = local_f0;
  TestSpecParser::TestSpecParser(in_RDI,in_stack_fffffffffffffec8);
  TestSpecParser::parse(in_stack_fffffffffffffee8,arg_00);
  TestSpecParser::testSpec(this);
  TestSpecParser::~TestSpecParser(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (TestSpec *)this;
  }
  __stack_chk_fail();
}

Assistant:

TestSpec parseTestSpec( std::string const& arg ) {
        return TestSpecParser( ITagAliasRegistry::get() ).parse( arg ).testSpec();
    }